

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::E_formatter<spdlog::details::null_scoped_padder>::format
          (E_formatter<spdlog::details::null_scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  unsigned_long uVar2;
  unsigned_long value;
  format_int fStack_38;
  
  lVar1 = (msg->time).__d.__r;
  uVar2 = lVar1 / 1000000000;
  value = -uVar2;
  if (0 < (long)uVar2) {
    value = uVar2;
  }
  fStack_38.str_ = fmt::v7::format_int::format_unsigned<unsigned_long>(&fStack_38,value);
  if (lVar1 < -999999999) {
    fStack_38.str_[-1] = '-';
    fStack_38.str_ = fStack_38.str_ + -1;
  }
  if (-0x16 < (long)&fStack_38 - (long)fStack_38.str_) {
    fmt::v7::detail::buffer<char>::append<char>
              (&dest->super_buffer<char>,fStack_38.str_,
               fStack_38.str_ + ((long)&fStack_38 - (long)fStack_38.str_) + 0x15);
    return;
  }
  fmt::v7::detail::assert_fail
            ("/workspace/llm4binary/github/license_all_cmakelists_25/dkubek[P]NPRG041-image_match/extern/spdlog/spdlog/fmt/bundled/core.h"
             ,0x146,"negative value");
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }